

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandRetime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  uint local_58;
  uint local_54;
  int nDelayLim;
  int Mode;
  int fVerbose;
  int fOneStep;
  int fBackward;
  int fForward;
  int nMaxIters;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  local_54 = 5;
  local_58 = 0;
  fOneStep = 0;
  fVerbose = 0;
  Mode = 0;
  nDelayLim = 0;
  Extra_UtilGetoptReset();
LAB_00244a98:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"MDfbsvh");
    if (iVar1 == -1) {
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      if ((fOneStep != 0) && (fVerbose != 0)) {
        Abc_Print(-1,"Only one switch \"-f\" or \"-b\" can be selected at a time.\n");
        return 1;
      }
      iVar1 = Abc_NtkLatchNum(pAVar3);
      if (iVar1 == 0) {
        return 0;
      }
      if ((-1 < (int)local_54) && ((int)local_54 < 7)) {
        iVar1 = Abc_NtkIsStrash(pAVar3);
        if (iVar1 != 0) {
          iVar1 = Abc_NtkGetChoiceNum(pAVar3);
          if (iVar1 != 0) {
            Abc_Print(-1,"Retiming with choice nodes is not implemented.\n");
            return 0;
          }
          pAVar3 = Abc_NtkToLogic(pAVar3);
          Abc_NtkRetime(pAVar3,local_54,local_58,fOneStep,fVerbose,Mode,nDelayLim);
          Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
          return 0;
        }
        iVar1 = Abc_NtkToSop(pAVar3,-1,1000000000);
        if (iVar1 == 0) {
          Abc_Print(-1,"Converting to SOPs has failed.\n");
          return 0;
        }
        iVar1 = Abc_NtkIsLogic(pAVar3);
        if (iVar1 == 0) {
          Abc_Print(-1,"The network is not a logic network. Retiming is not performed.\n");
          return 0;
        }
        Abc_NtkRetime(pAVar3,local_54,local_58,fOneStep,fVerbose,Mode,nDelayLim);
        return 0;
      }
      Abc_Print(-1,"The mode (%d) is incorrect. Retiming is not performed.\n",(ulong)local_54);
      return 0;
    }
    switch(iVar1) {
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by a positive integer.\n");
        goto LAB_00244d8c;
      }
      local_58 = atoi(argv[globalUtilOptind]);
      uVar2 = local_58;
      break;
    default:
      goto LAB_00244d8c;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by a positive integer.\n");
        goto LAB_00244d8c;
      }
      local_54 = atoi(argv[globalUtilOptind]);
      uVar2 = local_54;
      break;
    case 0x62:
      fVerbose = fVerbose ^ 1;
      goto LAB_00244a98;
    case 0x66:
      fOneStep = fOneStep ^ 1;
      goto LAB_00244a98;
    case 0x68:
      goto LAB_00244d8c;
    case 0x73:
      Mode = Mode ^ 1;
      goto LAB_00244a98;
    case 0x76:
      nDelayLim = nDelayLim ^ 1;
      goto LAB_00244a98;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_00244d8c:
      Abc_Print(-2,"usage: retime [-MD num] [-fbvh]\n");
      Abc_Print(-2,"\t         retimes the current network using one of the algorithms:\n");
      Abc_Print(-2,"\t             1: most forward retiming\n");
      Abc_Print(-2,"\t             2: most backward retiming\n");
      Abc_Print(-2,"\t             3: forward and backward min-area retiming\n");
      Abc_Print(-2,"\t             4: forward and backward min-delay retiming\n");
      Abc_Print(-2,"\t             5: mode 3 followed by mode 4\n");
      Abc_Print(-2,"\t             6: Pan\'s optimum-delay retiming using binary search\n");
      Abc_Print(-2,"\t-M num : the retiming algorithm to use [default = %d]\n",(ulong)local_54);
      Abc_Print(-2,"\t-D num : the minimum delay target (0=unused) [default = %d]\n",(ulong)local_58
               );
      pcVar4 = "no";
      if (fOneStep != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-f     : enables forward-only retiming in modes 3,4,5 [default = %s]\n",pcVar4
               );
      pcVar4 = "no";
      if (fVerbose != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-b     : enables backward-only retiming in modes 3,4,5 [default = %s]\n",
                pcVar4);
      pcVar4 = "no";
      if (Mode != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-s     : enables retiming one step only in mode 4 [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (nDelayLim != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : enables verbose output [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandRetime( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nMaxIters;
    int fForward;
    int fBackward;
    int fOneStep;
    int fVerbose;
    int Mode;
    int nDelayLim;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Mode      =  5;
    nDelayLim =  0;
    fForward  =  0;
    fBackward =  0;
    fOneStep  =  0;
    fVerbose  =  0;
    nMaxIters = 15;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MDfbsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            Mode = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Mode < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nDelayLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nDelayLim < 0 )
                goto usage;
            break;
        case 'f':
            fForward ^= 1;
            break;
        case 'b':
            fBackward ^= 1;
            break;
        case 's':
            fOneStep ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fForward && fBackward )
    {
        Abc_Print( -1, "Only one switch \"-f\" or \"-b\" can be selected at a time.\n" );
        return 1;
    }

    if ( !Abc_NtkLatchNum(pNtk) )
    {
//        Abc_Print( -1, "The network has no latches. Retiming is not performed.\n" );
        return 0;
    }

    if ( Mode < 0 || Mode > 6 )
    {
        Abc_Print( -1, "The mode (%d) is incorrect. Retiming is not performed.\n", Mode );
        return 0;
    }

    if ( Abc_NtkIsStrash(pNtk) )
    {
        if ( Abc_NtkGetChoiceNum(pNtk) )
        {
            Abc_Print( -1, "Retiming with choice nodes is not implemented.\n" );
            return 0;
        }
        // convert the network into an SOP network
        pNtkRes = Abc_NtkToLogic( pNtk );
        // perform the retiming
        Abc_NtkRetime( pNtkRes, Mode, nDelayLim, fForward, fBackward, fOneStep, fVerbose );
        // replace the current network
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
        return 0;
    }

    // get the network in the SOP form
    if ( !Abc_NtkToSop(pNtk, -1, ABC_INFINITY) )
    {
        Abc_Print( -1, "Converting to SOPs has failed.\n" );
        return 0;
    }

    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "The network is not a logic network. Retiming is not performed.\n" );
        return 0;
    }

    // perform the retiming
    Abc_NtkRetime( pNtk, Mode, nDelayLim, fForward, fBackward, fOneStep, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: retime [-MD num] [-fbvh]\n" );
    Abc_Print( -2, "\t         retimes the current network using one of the algorithms:\n" );
    Abc_Print( -2, "\t             1: most forward retiming\n" );
    Abc_Print( -2, "\t             2: most backward retiming\n" );
    Abc_Print( -2, "\t             3: forward and backward min-area retiming\n" );
    Abc_Print( -2, "\t             4: forward and backward min-delay retiming\n" );
    Abc_Print( -2, "\t             5: mode 3 followed by mode 4\n" );
    Abc_Print( -2, "\t             6: Pan's optimum-delay retiming using binary search\n" );
    Abc_Print( -2, "\t-M num : the retiming algorithm to use [default = %d]\n", Mode );
    Abc_Print( -2, "\t-D num : the minimum delay target (0=unused) [default = %d]\n", nDelayLim );
    Abc_Print( -2, "\t-f     : enables forward-only retiming in modes 3,4,5 [default = %s]\n", fForward? "yes": "no" );
    Abc_Print( -2, "\t-b     : enables backward-only retiming in modes 3,4,5 [default = %s]\n", fBackward? "yes": "no" );
    Abc_Print( -2, "\t-s     : enables retiming one step only in mode 4 [default = %s]\n", fOneStep? "yes": "no" );
    Abc_Print( -2, "\t-v     : enables verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
//    Abc_Print( -2, "\t-I num : max number of iterations of l-value computation [default = %d]\n", nMaxIters );
//    Abc_Print( -2, "\t-f     : toggle forward retiming (for AIGs) [default = %s]\n", fForward? "yes": "no" );
//    Abc_Print( -2, "\t-b     : toggle backward retiming (for AIGs) [default = %s]\n", fBackward? "yes": "no" );
//    Abc_Print( -2, "\t-i     : toggle computation of initial state [default = %s]\n", fInitial? "yes": "no" );
}